

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_max_stream_data
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  int iVar1;
  quicly_stream_t *m;
  int in_EDX;
  long in_RDI;
  quicly_stream_t *stream;
  quicly_conn_t *conn;
  quicly_stream_t *in_stack_ffffffffffffffc8;
  quicly_stream_id_t in_stack_ffffffffffffffd0;
  
  m = quicly_get_stream((quicly_conn_t *)(in_RDI + -0x630),in_stack_ffffffffffffffd0);
  if (m != (quicly_stream_t *)0x0) {
    if (in_EDX == 0) {
      quicly_maxsender_lost
                ((quicly_maxsender_t *)m,(quicly_maxsender_sent_t *)in_stack_ffffffffffffffc8);
      iVar1 = should_send_max_stream_data(in_stack_ffffffffffffffc8);
      if (iVar1 != 0) {
        sched_stream_control((quicly_stream_t *)0x145f7b);
      }
    }
    else {
      quicly_maxsender_acked
                ((quicly_maxsender_t *)m,(quicly_maxsender_sent_t *)in_stack_ffffffffffffffc8);
    }
  }
  return 0;
}

Assistant:

static int on_ack_max_stream_data(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream.stream_id)) != NULL) {
        if (acked) {
            quicly_maxsender_acked(&stream->_send_aux.max_stream_data_sender, &sent->data.max_stream_data.args);
        } else {
            quicly_maxsender_lost(&stream->_send_aux.max_stream_data_sender, &sent->data.max_stream_data.args);
            if (should_send_max_stream_data(stream))
                sched_stream_control(stream);
        }
    }

    return 0;
}